

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

HaF64 __thiscall dgPolyhedra::EdgePenalty(dgPolyhedra *this,dgBigVector *pool,dgEdge *edge)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  dgEdge *pdVar23;
  dgEdge *pdVar24;
  int iVar25;
  dgPolyhedra *this_00;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ulong uVar26;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar54 [16];
  undefined8 uVar53;
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 in_ZMM17 [64];
  undefined1 local_58 [16];
  double local_48;
  double local_40;
  undefined1 local_38 [16];
  double local_28;
  double local_20;
  
  auVar29 = in_ZMM17._0_16_;
  iVar25 = edge->m_next->m_incidentVertex;
  auVar27._0_8_ = pool[iVar25].super_dgTemplateVector<double>.m_x;
  auVar27._8_8_ = pool[iVar25].super_dgTemplateVector<double>.m_y;
  dVar16 = pool[iVar25].super_dgTemplateVector<double>.m_z -
           pool[edge->m_incidentVertex].super_dgTemplateVector<double>.m_z;
  auVar15._0_8_ = pool[edge->m_incidentVertex].super_dgTemplateVector<double>.m_x;
  auVar15._8_8_ = pool[edge->m_incidentVertex].super_dgTemplateVector<double>.m_y;
  auVar27 = vsubpd_avx(auVar27,auVar15);
  dVar46 = pool[iVar25].super_dgTemplateVector<double>.m_w;
  auVar37._8_8_ = dVar46;
  auVar37._0_8_ = dVar46;
  auVar37._16_8_ = dVar46;
  auVar37._24_8_ = dVar46;
  auVar41._8_8_ = dVar16;
  auVar41._0_8_ = dVar16;
  auVar41._16_8_ = dVar16;
  auVar41._24_8_ = dVar16;
  auVar31 = vblendpd_avx(ZEXT1632(auVar27),auVar41,4);
  auVar31 = vblendpd_avx(auVar31,auVar37,8);
  auVar30._8_8_ = 0x7fffffffffffffff;
  auVar30._0_8_ = 0x7fffffffffffffff;
  auVar30._16_8_ = 0x7fffffffffffffff;
  auVar30._24_8_ = 0x7fffffffffffffff;
  auVar30 = vandpd_avx512vl(auVar31,auVar30);
  auVar31._8_8_ = 0x7fefffffffffffff;
  auVar31._0_8_ = 0x7fefffffffffffff;
  auVar31._16_8_ = 0x7fefffffffffffff;
  auVar31._24_8_ = 0x7fefffffffffffff;
  uVar26 = vpcmpgtq_avx512vl(auVar30,auVar31);
  if ((uVar26 & 0xf) == 0) {
    auVar28._0_8_ = auVar27._0_8_ * auVar27._0_8_;
    auVar28._8_8_ = auVar27._8_8_ * auVar27._8_8_;
    auVar15 = vshufpd_avx(auVar28,auVar28,1);
    auVar27 = vfmadd231sd_fma(auVar15,auVar27,auVar27);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar16;
    auVar27 = vfmadd213sd_fma(auVar43,auVar43,auVar27);
    if (auVar27._0_8_ < 9.999999974752427e-07) {
      return -1.0;
    }
    iVar25 = edge->m_incidentFace;
    if ((iVar25 < 1) || (edge->m_twin->m_incidentFace < 1)) {
LAB_0085ae1b:
      pdVar23 = edge->m_twin;
      iVar9 = pdVar23->m_incidentVertex;
      dVar46 = pool[iVar9].super_dgTemplateVector<double>.m_x;
      dVar16 = pool[iVar9].super_dgTemplateVector<double>.m_z;
      if (!NAN(dVar16)) {
        auVar3._0_8_ = pool[iVar9].super_dgTemplateVector<double>.m_y;
        auVar3._8_8_ = pool[iVar9].super_dgTemplateVector<double>.m_z;
        auVar17._8_8_ = 0x7fffffffffffffff;
        auVar17._0_8_ = 0x7fffffffffffffff;
        auVar27 = vpandq_avx512vl(auVar3,auVar17);
        auVar18._8_8_ = 0x7fefffffffffffff;
        auVar18._0_8_ = 0x7fefffffffffffff;
        uVar26 = vpcmpgtq_avx512vl(auVar27,auVar18);
        if (((((uVar26 & 3) >> 1 == 0) && (!NAN((double)auVar3._0_8_))) &&
            ((ulong)ABS(dVar46) < 0x7ff0000000000000)) && ((uVar26 & 1) == 0)) {
          auVar45._8_8_ = 0x7fffffffffffffff;
          auVar45._0_8_ = 0x7fffffffffffffff;
          auVar45._16_8_ = 0x7fffffffffffffff;
          auVar45._24_8_ = 0x7fffffffffffffff;
          auVar50._8_8_ = 0x7fefffffffffffff;
          auVar50._0_8_ = 0x7fefffffffffffff;
          auVar50._16_8_ = 0x7fefffffffffffff;
          auVar50._24_8_ = 0x7fefffffffffffff;
          vxorpd_avx512vl(auVar29,auVar29);
          pdVar24 = edge;
          do {
            pdVar24 = pdVar24->m_twin;
            iVar10 = pdVar24->m_incidentFace;
            if (((iVar10 != pdVar23->m_incidentFace) && (-1 < iVar10 && iVar10 != iVar25)) &&
               ((pdVar24->m_next->m_incidentFace == iVar10 &&
                (pdVar24->m_prev->m_incidentFace == iVar10)))) {
              iVar10 = pdVar24->m_next->m_incidentVertex;
              iVar11 = pdVar24->m_incidentVertex;
              iVar12 = pdVar24->m_prev->m_incidentVertex;
              dVar13 = pool[iVar11].super_dgTemplateVector<double>.m_x;
              dVar14 = pool[iVar10].super_dgTemplateVector<double>.m_x;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = dVar14;
              dVar52 = pool[iVar12].super_dgTemplateVector<double>.m_x;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = dVar52;
              dVar1 = pool[iVar12].super_dgTemplateVector<double>.m_y;
              auVar29._0_8_ = pool[iVar10].super_dgTemplateVector<double>.m_y;
              auVar29._8_8_ = pool[iVar10].super_dgTemplateVector<double>.m_z;
              auVar4._0_8_ = pool[iVar11].super_dgTemplateVector<double>.m_y;
              auVar4._8_8_ = pool[iVar11].super_dgTemplateVector<double>.m_z;
              dVar2 = pool[iVar12].super_dgTemplateVector<double>.m_z;
              auVar70._8_8_ = 0;
              auVar70._0_8_ = dVar2;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = pool[iVar10].super_dgTemplateVector<double>.m_z;
              auVar28 = vmovddup_avx512vl(auVar8);
              auVar15 = vsubpd_avx(auVar4,auVar29);
              auVar27 = vunpcklpd_avx(auVar70,auVar60);
              auVar28 = vunpcklpd_avx512vl(auVar28,auVar51);
              auVar28 = vsubpd_avx(auVar27,auVar28);
              auVar73._8_8_ = 0;
              auVar73._0_8_ = dVar13 - dVar14;
              auVar27 = vshufpd_avx(auVar15,auVar73,1);
              auVar81._8_8_ = 0;
              auVar81._0_8_ = dVar1 - (double)auVar29._0_8_;
              auVar29 = vunpcklpd_avx512vl(auVar81,auVar28);
              auVar27 = vmulpd_avx512vl(auVar29,auVar27);
              auVar29 = vfmsub231pd_fma(auVar27,auVar15,auVar28);
              auVar27 = vshufpd_avx(auVar28,auVar28,1);
              auVar54._8_8_ = 0;
              auVar54._0_8_ = auVar15._0_8_ * auVar27._0_8_;
              auVar27 = vfmsub231sd_fma(auVar54,auVar73,auVar81);
              dVar14 = pool[iVar11].super_dgTemplateVector<double>.m_w;
              auVar76._8_8_ = dVar14;
              auVar76._0_8_ = dVar14;
              auVar76._16_8_ = dVar14;
              auVar76._24_8_ = dVar14;
              uVar53 = auVar27._0_8_;
              auVar78._8_8_ = uVar53;
              auVar78._0_8_ = uVar53;
              auVar78._16_8_ = uVar53;
              auVar78._24_8_ = uVar53;
              auVar31 = vblendpd_avx(ZEXT1632(auVar29),auVar78,4);
              auVar31 = vblendpd_avx(auVar31,auVar76,8);
              auVar31 = vandpd_avx(auVar31,auVar45);
              uVar26 = vpcmpgtq_avx512vl(auVar31,auVar50);
              if ((uVar26 & 0xf) != 0) goto LAB_0085b254;
              auVar28 = vsubpd_avx(auVar4,auVar3);
              dVar1 = dVar1 - (double)auVar3._0_8_;
              dVar13 = dVar13 - dVar46;
              dVar2 = dVar2 - dVar16;
              dVar52 = dVar52 - dVar46;
              auVar15 = vshufpd_avx(auVar28,auVar28,1);
              auVar58._8_8_ = 0;
              auVar58._0_8_ = dVar1 * auVar15._0_8_;
              auVar65._8_8_ = 0;
              auVar65._0_8_ = dVar2;
              auVar43 = vfmsub231sd_fma(auVar58,auVar28,auVar65);
              auVar61._8_8_ = 0;
              auVar61._0_8_ = dVar52;
              auVar66._8_8_ = 0;
              auVar66._0_8_ = dVar2 * dVar13;
              auVar15 = vfmsub231sd_fma(auVar66,auVar61,auVar15);
              auVar62._8_8_ = 0;
              auVar62._0_8_ = dVar52 * auVar28._0_8_;
              auVar74._8_8_ = 0;
              auVar74._0_8_ = dVar13;
              auVar82._8_8_ = 0;
              auVar82._0_8_ = dVar1;
              auVar28 = vfmsub231sd_fma(auVar62,auVar74,auVar82);
              uVar26 = auVar28._0_8_ & 0x7fffffffffffffff;
              if (((0x7fefffffffffffff < (auVar43._0_8_ & 0x7fffffffffffffff)) ||
                  (0x7fefffffffffffff < (ulong)ABS(auVar15._0_8_))) || (0x7fefffffffffffff < uVar26)
                 ) goto LAB_0085b254;
              auVar33 = vshufpd_avx(auVar29,auVar29,1);
              auVar67._8_8_ = 0;
              auVar67._0_8_ = auVar33._0_8_ * auVar15._0_8_;
              auVar15 = vfmadd213sd_fma(auVar43,auVar29,auVar67);
              auVar27 = vfmadd213sd_fma(auVar28,auVar27,auVar15);
              vucomisd_avx512f(auVar27);
              if (0x7fefffffffffffff < uVar26) {
                return -1.0;
              }
            }
            pdVar24 = pdVar24->m_next;
          } while (pdVar24 != edge);
          pdVar23 = pdVar23->m_next->m_twin->m_next;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = dVar46;
          if (pdVar23 == edge) {
            auVar27 = ZEXT816(0x3ff0000000000000);
          }
          else {
            auVar32 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            auVar59._8_8_ = 0x7fefffffffffffff;
            auVar59._0_8_ = 0x7fefffffffffffff;
            auVar15 = vunpcklpd_avx(auVar35,auVar3);
            auVar55._8_8_ = 0x7fffffffffffffff;
            auVar55._0_8_ = 0x7fffffffffffffff;
            do {
              if (0 < pdVar23->m_incidentFace) {
                iVar25 = pdVar23->m_next->m_incidentVertex;
                dVar13 = pool[iVar25].super_dgTemplateVector<double>.m_z;
                auVar5._0_8_ = pool[iVar25].super_dgTemplateVector<double>.m_x;
                auVar5._8_8_ = pool[iVar25].super_dgTemplateVector<double>.m_y;
                dVar14 = pool[iVar25].super_dgTemplateVector<double>.m_w;
                auVar72._8_8_ = dVar14;
                auVar72._0_8_ = dVar14;
                auVar72._16_8_ = dVar14;
                auVar72._24_8_ = dVar14;
                dVar14 = dVar13 - dVar16;
                auVar27 = vsubpd_avx(auVar5,auVar15);
                auVar79._8_8_ = dVar14;
                auVar79._0_8_ = dVar14;
                auVar79._16_8_ = dVar14;
                auVar79._24_8_ = dVar14;
                auVar31 = vblendpd_avx(ZEXT1632(auVar27),auVar79,4);
                auVar31 = vblendpd_avx(auVar31,auVar72,8);
                auVar31 = vandpd_avx(auVar31,auVar45);
                uVar26 = vpcmpgtq_avx512vl(auVar31,auVar50);
                if ((uVar26 & 0xf) != 0) goto LAB_0085b254;
                iVar25 = pdVar23->m_prev->m_incidentVertex;
                auVar6._0_8_ = pool[iVar25].super_dgTemplateVector<double>.m_x;
                auVar6._8_8_ = pool[iVar25].super_dgTemplateVector<double>.m_y;
                auVar29 = vsubpd_avx(auVar6,auVar5);
                dVar13 = pool[iVar25].super_dgTemplateVector<double>.m_z - dVar13;
                dVar52 = pool[iVar25].super_dgTemplateVector<double>.m_w;
                auVar77._8_8_ = dVar52;
                auVar77._0_8_ = dVar52;
                auVar77._16_8_ = dVar52;
                auVar77._24_8_ = dVar52;
                auVar80._8_8_ = dVar13;
                auVar80._0_8_ = dVar13;
                auVar80._16_8_ = dVar13;
                auVar80._24_8_ = dVar13;
                auVar31 = vblendpd_avx(ZEXT1632(auVar29),auVar80,4);
                auVar31 = vblendpd_avx(auVar31,auVar77,8);
                auVar31 = vandpd_avx(auVar31,auVar45);
                uVar26 = vpcmpgtq_avx512vl(auVar31,auVar50);
                if ((uVar26 & 0xf) != 0) goto LAB_0085b254;
                dVar52 = dVar46 - pool[iVar25].super_dgTemplateVector<double>.m_x;
                if (0x7fefffffffffffff < (long)ABS(dVar52)) goto LAB_0085b254;
                auVar7._0_8_ = pool[iVar25].super_dgTemplateVector<double>.m_y;
                auVar7._8_8_ = pool[iVar25].super_dgTemplateVector<double>.m_z;
                auVar43 = vsubpd_avx(auVar3,auVar7);
                auVar28 = vandpd_avx(auVar43,auVar55);
                uVar26 = vpcmpgtq_avx512vl(auVar28,auVar59);
                if ((((uVar26 & 1) != 0) || ((uVar26 & 3) >> 1 != 0)) ||
                   (0x7fefffffffffffff < (ulong)ABS(pool[iVar9].super_dgTemplateVector<double>.m_w))
                   ) goto LAB_0085b254;
                auVar83._0_8_ = auVar27._0_8_ * auVar27._0_8_;
                auVar83._8_8_ = auVar27._8_8_ * auVar27._8_8_;
                auVar28 = vshufpd_avx(auVar83,auVar83,1);
                auVar28 = vfmadd231sd_fma(auVar28,auVar27,auVar27);
                auVar68._0_8_ = auVar29._0_8_ * auVar29._0_8_;
                auVar68._8_8_ = auVar29._8_8_ * auVar29._8_8_;
                auVar27 = vshufpd_avx(auVar68,auVar68,1);
                auVar27 = vfmadd231sd_fma(auVar27,auVar29,auVar29);
                auVar63._8_8_ = 0;
                auVar63._0_8_ = dVar14;
                auVar29 = vfmadd213sd_fma(auVar63,auVar63,auVar28);
                auVar71._8_8_ = 0;
                auVar71._0_8_ = dVar13;
                auVar33 = vfmadd213sd_fma(auVar71,auVar71,auVar27);
                auVar69._8_8_ = 0;
                auVar69._0_8_ = auVar43._0_8_ * auVar43._0_8_;
                auVar75._8_8_ = 0;
                auVar75._0_8_ = dVar52;
                auVar47 = vfmadd213sd_fma(auVar75,auVar75,auVar69);
                auVar28 = vshufpd_avx(auVar43,auVar43,1);
                auVar27 = vmaxsd_avx(auVar33,auVar29);
                auVar29 = vminsd_avx(auVar33,auVar29);
                auVar28 = vfmadd213sd_fma(auVar28,auVar28,auVar47);
                auVar27 = vmaxsd_avx(auVar28,auVar27);
                auVar29 = vminsd_avx(auVar28,auVar29);
                auVar64._0_8_ = auVar29._0_8_ / auVar27._0_8_;
                auVar64._8_8_ = auVar29._8_8_;
                auVar27 = vminsd_avx(auVar64,auVar32._0_16_);
                auVar32 = ZEXT1664(auVar27);
              }
              auVar27 = auVar32._0_16_;
              pdVar23 = pdVar23->m_twin->m_next;
            } while (pdVar23 != edge);
          }
          if (0.0 <= auVar27._0_8_) {
            auVar27 = vsqrtsd_avx(auVar27,auVar27);
            return auVar27._0_8_;
          }
          dVar46 = sqrt(auVar27._0_8_);
          return (HaF64)dVar46;
        }
      }
      __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                    ,0x159,
                    "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)");
    }
    this_00 = (dgPolyhedra *)pool;
    FaceNormal((dgBigVector *)local_38,(dgPolyhedra *)pool,edge,(HaF64 *)pool,0x20);
    FaceNormal((dgBigVector *)local_58,this_00,edge->m_twin,(HaF64 *)pool,0x20);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_28;
    dVar46 = local_38._0_8_;
    auVar33._0_8_ = dVar46 * dVar46;
    dVar16 = local_38._8_8_;
    auVar33._8_8_ = dVar16 * dVar16;
    auVar27 = vshufpd_avx(auVar33,auVar33,1);
    auVar27 = vfmadd231sd_fma(auVar27,local_38,local_38);
    auVar27 = vfmadd231sd_fma(auVar27,auVar47,auVar47);
    if (auVar27._0_8_ < 1.0000000195414814e-24) {
      return -1.0;
    }
    dVar13 = local_58._0_8_;
    auVar38._0_8_ = dVar13 * dVar13;
    dVar14 = local_58._8_8_;
    auVar38._8_8_ = dVar14 * dVar14;
    auVar15 = vshufpd_avx(auVar38,auVar38,1);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_48;
    auVar15 = vfmadd231sd_fma(auVar15,local_58,local_58);
    auVar15 = vfmadd231sd_fma(auVar15,auVar39,auVar39);
    if (auVar15._0_8_ < 1.0000000195414814e-24) {
      return -1.0;
    }
    auVar27 = vsqrtsd_avx(auVar27,auVar27);
    dVar52 = 1.0 / auVar27._0_8_;
    auVar34._0_8_ = dVar46 * dVar52;
    auVar34._8_8_ = dVar16 * dVar52;
    local_28 = local_28 * dVar52;
    auVar48._8_8_ = local_20;
    auVar48._0_8_ = local_20;
    auVar48._16_8_ = local_20;
    auVar48._24_8_ = local_20;
    auVar56._8_8_ = local_28;
    auVar56._0_8_ = local_28;
    auVar56._16_8_ = local_28;
    auVar56._24_8_ = local_28;
    auVar31 = vblendpd_avx(ZEXT1632(auVar34),auVar56,4);
    auVar31 = vblendpd_avx(auVar31,auVar48,8);
    auVar19._8_8_ = 0x7fffffffffffffff;
    auVar19._0_8_ = 0x7fffffffffffffff;
    auVar19._16_8_ = 0x7fffffffffffffff;
    auVar19._24_8_ = 0x7fffffffffffffff;
    auVar31 = vandpd_avx512vl(auVar31,auVar19);
    auVar20._8_8_ = 0x7fefffffffffffff;
    auVar20._0_8_ = 0x7fefffffffffffff;
    auVar20._16_8_ = 0x7fefffffffffffff;
    auVar20._24_8_ = 0x7fefffffffffffff;
    uVar26 = vpcmpgtq_avx512vl(auVar31,auVar20);
    if ((uVar26 & 0xf) == 0) {
      auVar27 = vsqrtsd_avx(auVar15,auVar15);
      dVar46 = 1.0 / auVar27._0_8_;
      auVar44._0_8_ = dVar13 * dVar46;
      auVar44._8_8_ = dVar14 * dVar46;
      local_48 = local_48 * dVar46;
      auVar42._8_8_ = local_40;
      auVar42._0_8_ = local_40;
      auVar42._16_8_ = local_40;
      auVar42._24_8_ = local_40;
      auVar49._8_8_ = local_48;
      auVar49._0_8_ = local_48;
      auVar49._16_8_ = local_48;
      auVar49._24_8_ = local_48;
      auVar31 = vblendpd_avx(ZEXT1632(auVar44),auVar49,4);
      auVar31 = vblendpd_avx(auVar31,auVar42,8);
      auVar21._8_8_ = 0x7fffffffffffffff;
      auVar21._0_8_ = 0x7fffffffffffffff;
      auVar21._16_8_ = 0x7fffffffffffffff;
      auVar21._24_8_ = 0x7fffffffffffffff;
      auVar31 = vandpd_avx512vl(auVar31,auVar21);
      auVar22._8_8_ = 0x7fefffffffffffff;
      auVar22._0_8_ = 0x7fefffffffffffff;
      auVar22._16_8_ = 0x7fefffffffffffff;
      auVar22._24_8_ = 0x7fefffffffffffff;
      uVar26 = vpcmpgtq_avx512vl(auVar31,auVar22);
      if ((uVar26 & 0xf) == 0) {
        auVar40._0_8_ = auVar34._0_8_ * auVar44._0_8_;
        auVar40._8_8_ = auVar34._8_8_ * auVar44._8_8_;
        auVar27 = vshufpd_avx(auVar40,auVar40,1);
        auVar27 = vfmadd231sd_fma(auVar27,auVar34,auVar44);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = local_48;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = local_28;
        auVar27 = vfmadd213sd_fma(auVar36,auVar57,auVar27);
        pdVar23 = edge;
        if (auVar27._0_8_ < -0.8999999761581421) {
          return -1.0;
        }
        do {
          if ((pdVar23->m_incidentFace < 1) ||
             (pdVar24 = pdVar23->m_twin, pdVar24->m_incidentFace < 1)) {
            pdVar23 = edge;
            do {
              if (pdVar23->m_incidentFace < 1) {
                return -1.0;
              }
              if (pdVar23->m_twin->m_incidentFace < 1) {
                return -1.0;
              }
              pdVar23 = pdVar23->m_twin->m_next;
            } while (pdVar23 != edge->m_twin);
            pdVar24 = pdVar23->m_twin;
          }
          pdVar23 = pdVar24->m_next;
        } while (pdVar24->m_next != edge);
        iVar25 = edge->m_incidentFace;
        goto LAB_0085ae1b;
      }
    }
  }
LAB_0085b254:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
}

Assistant:

hacd::HaF64 dgPolyhedra::EdgePenalty (const dgBigVector* const pool, dgEdge* const edge) const
{
	hacd::HaI32 i0 = edge->m_incidentVertex;
	hacd::HaI32 i1 = edge->m_next->m_incidentVertex;

	const dgBigVector& p0 = pool[i0];
	const dgBigVector& p1 = pool[i1];
	dgBigVector dp (p1 - p0);

	hacd::HaF64 dot = dp % dp;
	if (dot < hacd::HaF64(1.0e-6f)) {
		return hacd::HaF64 (-1.0f);
	}

	if ((edge->m_incidentFace > 0) && (edge->m_twin->m_incidentFace > 0)) {
		dgBigVector edgeNormal (FaceNormal (edge, &pool[0].m_x, sizeof (dgBigVector)));
		dgBigVector twinNormal (FaceNormal (edge->m_twin, &pool[0].m_x, sizeof (dgBigVector)));

		hacd::HaF64 mag0 = edgeNormal % edgeNormal;
		hacd::HaF64 mag1 = twinNormal % twinNormal;
		if ((mag0 < hacd::HaF64 (1.0e-24f)) || (mag1 < hacd::HaF64 (1.0e-24f))) {
			return hacd::HaF64 (-1.0f);
		}

		edgeNormal = edgeNormal.Scale (hacd::HaF64 (1.0f) / sqrt(mag0));
		twinNormal = twinNormal.Scale (hacd::HaF64 (1.0f) / sqrt(mag1));

		dot = edgeNormal % twinNormal;
		if (dot < hacd::HaF64 (-0.9f)) {
			return hacd::HaF32 (-1.0f);
		}

		dgEdge* ptr = edge;
		do {
			if ((ptr->m_incidentFace <= 0) || (ptr->m_twin->m_incidentFace <= 0)){
				dgEdge* const adj = edge->m_twin;
				ptr = edge;
				do {
					if ((ptr->m_incidentFace <= 0) || (ptr->m_twin->m_incidentFace <= 0)){
						return hacd::HaF32 (-1.0);
					}
					ptr = ptr->m_twin->m_next;
				} while (ptr != adj);
			}
			ptr = ptr->m_twin->m_next;
		} while (ptr != edge);
	}

	hacd::HaI32 faceA = edge->m_incidentFace;
	hacd::HaI32 faceB = edge->m_twin->m_incidentFace;

	i0 = edge->m_twin->m_incidentVertex;
	dgBigVector p (pool[i0].m_x, pool[i0].m_y, pool[i0].m_z, hacd::HaF32 (0.0f));

	bool penalty = false;
	dgEdge* ptr = edge;
	do {
		dgEdge* const adj = ptr->m_twin;

		hacd::HaI32 face = adj->m_incidentFace;
		if ((face != faceB) && (face != faceA) && (face >= 0) && (adj->m_next->m_incidentFace == face) && (adj->m_prev->m_incidentFace == face)){

			hacd::HaI32 i0 = adj->m_next->m_incidentVertex;
			const dgBigVector& p0 = pool[i0];

			hacd::HaI32 i1 = adj->m_incidentVertex;
			const dgBigVector& p1 = pool[i1];

			hacd::HaI32 i2 = adj->m_prev->m_incidentVertex;
			const dgBigVector& p2 = pool[i2];

			dgBigVector n0 ((p1 - p0) * (p2 - p0));
			dgBigVector n1 ((p1 - p) * (p2 - p));

//			hacd::HaF64 mag0 = n0 % n0;
//			HACD_ASSERT (mag0 > hacd::HaF64(1.0e-16f));
//			mag0 = sqrt (mag0);

//			hacd::HaF64 mag1 = n1 % n1;
//			mag1 = sqrt (mag1);

			hacd::HaF64 dot = n0 % n1;
			if (dot < hacd::HaF64 (0.0f)) {
//			if (dot <= (mag0 * mag1 * hacd::HaF32 (0.707f)) || (mag0 > (hacd::HaF64(16.0f) * mag1))) {
				penalty = true;
				break;
			}
		}

		ptr = ptr->m_twin->m_next;
	} while (ptr != edge);

	hacd::HaF64 aspect = hacd::HaF32 (-1.0f);
	if (!penalty) {
		hacd::HaI32 i0 = edge->m_twin->m_incidentVertex;
		dgBigVector p0 (pool[i0]);

		aspect = hacd::HaF32 (1.0f);
		for (dgEdge* ptr = edge->m_twin->m_next->m_twin->m_next; ptr != edge; ptr = ptr->m_twin->m_next) {
			if (ptr->m_incidentFace > 0) {
				hacd::HaI32 i0 = ptr->m_next->m_incidentVertex;
				const dgBigVector& p1 = pool[i0];

				hacd::HaI32 i1 = ptr->m_prev->m_incidentVertex;
				const dgBigVector& p2 = pool[i1];

				dgBigVector e0 (p1 - p0);
				dgBigVector e1 (p2 - p1);
				dgBigVector e2 (p0 - p2);

				hacd::HaF64 mag0 = e0 % e0;
				hacd::HaF64 mag1 = e1 % e1;
				hacd::HaF64 mag2 = e2 % e2;
				hacd::HaF64 maxMag = GetMax (mag0, mag1, mag2);
				hacd::HaF64 minMag = GetMin (mag0, mag1, mag2);
				hacd::HaF64 ratio = minMag / maxMag;

				if (ratio < aspect) {
					aspect = ratio;
				}
			}
		}
		aspect = sqrt (aspect);
		//aspect = 1.0f;
	}

	return aspect;
}